

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINAnalyzer.cpp
# Opt level: O1

void __thiscall LINAnalyzer::AdvanceHalfBit(LINAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  
  pAVar1 = this->mSerial;
  Analyzer::GetSampleRate();
  AnalyzerChannelData::Advance((uint)pAVar1);
  return;
}

Assistant:

void LINAnalyzer::AdvanceHalfBit()
{
    mSerial->Advance( HalfSamplesPerBit() );
}